

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cpp
# Opt level: O0

void __thiscall MeterPrivate::drawRanges(MeterPrivate *this,QPainter *painter,DrawParams *params)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  RangeData *pRVar7;
  qreal span;
  qreal angle;
  QBrush local_90 [8];
  QPen local_88 [8];
  const_iterator local_80;
  const_iterator last;
  const_iterator it;
  undefined1 local_50 [8];
  QRectF r;
  qreal m;
  qreal gridLabelSizeFactor;
  DrawParams *params_local;
  QPainter *painter_local;
  MeterPrivate *this_local;
  
  params->scaleDegree = (double)(this->stopScaleAngle - this->startScaleAngle);
  params->startScaleAngle = (double)this->startScaleAngle;
  params->margin = (double)this->radius / 20.0;
  params->scaleWidth = (double)this->radius / 30.0;
  params->gridLabelSize = (double)this->radius / 10.0;
  params->fontPixelSize = params->gridLabelSize * 0.75;
  r.h = params->margin + params->scaleWidth / 2.0;
  QMarginsF::QMarginsF((QMarginsF *)&it,r.h,r.h,r.h,r.h);
  operator-((QRectF *)local_50,&params->rect,(QMarginsF *)&it);
  QPainter::save();
  last = QMultiMap<int,_MeterPrivate::RangeData>::cbegin(&this->ranges);
  local_80._M_node = (_Base_ptr)QMultiMap<int,_MeterPrivate::RangeData>::cend(&this->ranges);
  while( true ) {
    bVar6 = operator!=(&last,(const_iterator *)&local_80);
    if (!bVar6) break;
    pRVar7 = QMultiMap<int,_MeterPrivate::RangeData>::const_iterator::value(&last);
    QBrush::QBrush(local_90,&pRVar7->color);
    QPen::QPen((QPen *)params->scaleWidth,local_88,local_90,1,0x10,0x40);
    QPainter::setPen((QPen *)painter);
    QPen::~QPen(local_88);
    QBrush::~QBrush(local_90);
    dVar1 = params->startScaleAngle;
    dVar2 = params->scaleDegree;
    pRVar7 = QMultiMap<int,_MeterPrivate::RangeData>::const_iterator::value(&last);
    dVar3 = pRVar7->start;
    dVar4 = this->maxValue;
    dVar5 = this->minValue;
    QMultiMap<int,_MeterPrivate::RangeData>::const_iterator::value(&last);
    QPainter::drawArc((QRectF *)painter,(int)local_50,
                      (int)((-90.0 - (dVar2 * (dVar3 / (dVar4 - dVar5)) + dVar1)) * 16.0));
    QMultiMap<int,_MeterPrivate::RangeData>::const_iterator::operator++(&last);
  }
  QPainter::restore();
  return;
}

Assistant:

void
MeterPrivate::drawRanges( QPainter & painter, DrawParams & params )
{
	params.scaleDegree = stopScaleAngle - startScaleAngle;
	params.startScaleAngle = startScaleAngle;
	params.margin = radius / 20.0;

	const qreal gridLabelSizeFactor = 10.0;

	params.scaleWidth = radius / ( gridLabelSizeFactor + 20.0 );
	params.gridLabelSize = radius / gridLabelSizeFactor;
	params.fontPixelSize = params.gridLabelSize * 0.75;

	const qreal m = params.margin + params.scaleWidth / 2.0;

	const QRectF r = params.rect - QMarginsF( m, m, m,m );

	painter.save();

	for( auto it = ranges.cbegin(), last = ranges.cend(); it != last; ++it )
	{
		painter.setPen( QPen( it.value().color, params.scaleWidth ) );
		const qreal angle = params.startScaleAngle +
			params.scaleDegree * ( it.value().start / ( maxValue - minValue ) );
		const qreal span = params.startScaleAngle +
			params.scaleDegree * ( it.value().stop / ( maxValue - minValue ) ) - angle;
		painter.drawArc( r, ( -90.0 - angle ) * 16, -span * 16 );
	}

	painter.restore();
}